

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O1

int opj_getopt_long(int argc,char **argv,char *optstring,opj_option_t *longopts,int totlen)

{
  char *pcVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  char cVar9;
  char *pcVar10;
  long lVar11;
  int unaff_R13D;
  int __c;
  
  cVar9 = '\x01';
  do {
    lVar6 = (long)opj_optind;
    if (argc <= opj_optind) {
      return -1;
    }
    pcVar10 = argv[lVar6];
    if (pcVar10 == (char *)0x0) {
      return -1;
    }
    if (*pcVar10 != '-') {
      return -1;
    }
    if (pcVar10[1] == '\0') {
      if (opj_optind < argc + -1) {
        cVar9 = (*argv[lVar6 + 1] != '-') * '\x02';
      }
      else {
        cVar9 = '\0';
      }
    }
    if (cVar9 == '\x01') {
      pcVar10 = pcVar10 + 1;
    }
    else {
      if (cVar9 == '\0') {
        opj_optind = opj_optind + 1;
        return 0x3f;
      }
      pcVar10 = argv[lVar6 + 1];
      opj_optind = opj_optind + 1;
    }
    sVar7 = strlen(pcVar10);
    iVar5 = opj_optind;
    if (sVar7 < 2) {
      if (*optstring == ':') {
        unaff_R13D = 0x3a;
        goto LAB_0010d8b3;
      }
      if (opj_getopt_long::lastidx != opj_optind) {
        opj_getopt_long::lastidx = opj_optind;
        opj_getopt_long::lastofs = 0;
      }
      iVar4 = opj_getopt_long::lastofs;
      lVar6 = (long)opj_optind;
      pcVar1 = argv[lVar6];
      lVar11 = (long)opj_getopt_long::lastofs;
      __c = (int)pcVar1[lVar11 + 1];
      opj_optopt = __c;
      pcVar8 = strchr(optstring,__c);
      if (pcVar8 == (char *)0x0) {
        opj_getopt_long_cold_1();
        goto LAB_0010d8ad;
      }
      if (*pcVar8 == '\0') {
        opj_optind = iVar5 + 1;
        bVar3 = true;
      }
      else {
        if (pcVar8[1] == ':') {
          if ((pcVar8[2] == ':') || (pcVar1[lVar11 + 2] != '\0')) {
            opj_optarg = (char *)0x0;
            if (pcVar1[lVar11 + 2] != '\0') {
              opj_optarg = pcVar1 + lVar11 + 2;
            }
          }
          else {
            opj_optarg = argv[lVar6 + 1];
            if ((((opj_optarg != (char *)0x0) && (*opj_optarg == '-')) && (opj_opterr != 0)) ||
               ((opj_optarg == (char *)0x0 && (opj_opterr != 0)))) {
              bVar3 = false;
              fprintf(_stderr,"%s: option requires an argument\n",pcVar10);
              unaff_R13D = 0x3f;
              goto LAB_0010d8ba;
            }
            opj_optind = iVar5 + 1;
          }
          opj_optind = opj_optind + 1;
        }
        else {
          opj_getopt_long::lastofs = iVar4 + 1;
        }
        bVar3 = false;
        unaff_R13D = __c;
      }
    }
    else {
      if (0 < totlen) {
        lVar6 = 0;
        do {
          iVar5 = strcmp(*(char **)((long)&longopts->name + lVar6),pcVar10);
          if (iVar5 == 0) {
            iVar5 = *(int *)((long)&longopts->has_arg + lVar6);
            if (iVar5 == 0) {
              if ((argv[(long)opj_optind + 1] != (char *)0x0) &&
                 (*argv[(long)opj_optind + 1] != '-')) {
                fprintf(_stderr,"%s: option does not require an argument. Ignoring %s\n",pcVar10);
                goto LAB_0010d841;
              }
            }
            else {
              opj_optarg = argv[(long)opj_optind + 1];
              if (opj_optarg != (char *)0x0) {
                if ((*opj_optarg == '-') && (opj_opterr != 0)) {
                  bVar3 = false;
                  fprintf(_stderr,"%s: option requires an argument\n",pcVar10);
                  unaff_R13D = 0x3f;
                  goto LAB_0010d8ba;
                }
                if (opj_optarg != (char *)0x0) goto LAB_0010d841;
              }
              if ((iVar5 == 1) && (opj_opterr != 0)) {
                bVar3 = false;
                fprintf(_stderr,"%s: option requires an argument \n",pcVar10);
                unaff_R13D = 0x3f;
                goto LAB_0010d8ba;
              }
LAB_0010d841:
              opj_optind = opj_optind + 1;
            }
            opj_optind = opj_optind + 1;
            piVar2 = *(int **)((long)&longopts->flag + lVar6);
            bVar3 = false;
            unaff_R13D = *(int *)((long)&longopts->val + lVar6);
            if (piVar2 != (int *)0x0) {
              *piVar2 = unaff_R13D;
              unaff_R13D = 0;
            }
            goto LAB_0010d8ba;
          }
          lVar6 = lVar6 + 0x20;
        } while ((int)lVar6 < totlen);
      }
      opj_getopt_long_cold_2();
LAB_0010d8ad:
      unaff_R13D = 0x3f;
LAB_0010d8b3:
      bVar3 = false;
    }
LAB_0010d8ba:
    if (!bVar3) {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

int opj_getopt_long(int argc, char * const argv[], const char *optstring,
const opj_option_t *longopts, int totlen) {
	static int lastidx,lastofs;
	const char *tmp;
	int i,len;
	char param = 1;

again:
	if (opj_optind >= argc || !argv[opj_optind] || *argv[opj_optind]!='-')
		return -1;

	if (argv[opj_optind][0]=='-' && argv[opj_optind][1]==0) {
		if(opj_optind >= (argc - 1)){ /* no more input parameters */
			param = 0;
		}
		else{ /* more input parameters */
			if(argv[opj_optind + 1][0] == '-'){
				param = 0; /* Missing parameter after '-' */
			}
			else{
				param = 2;
			}
		}
	}

	if (param == 0) {
		++opj_optind;
		return (BADCH);
	}

	if (argv[opj_optind][0]=='-') {	/* long option */
		char* arg=argv[opj_optind]+1;
		const opj_option_t* o;
		o=longopts;
		len=sizeof(longopts[0]);

		if (param > 1){
			arg = argv[opj_optind+1];
			opj_optind++;
		}
		else
			arg = argv[opj_optind]+1;

		if(strlen(arg)>1){
			for (i=0;i<totlen;i=i+len,o++) {
				if (!strcmp(o->name,arg)) {	/* match */
					if (o->has_arg == 0) {
						if ((argv[opj_optind+1])&&(!(argv[opj_optind+1][0]=='-'))){
							fprintf(stderr,"%s: option does not require an argument. Ignoring %s\n",arg,argv[opj_optind+1]);
							++opj_optind;
						}
					}else{ 
						opj_optarg=argv[opj_optind+1];
						if(opj_optarg){
							if (opj_optarg[0] == '-'){ /* Has read next input parameter: No arg for current parameter */								
								if (opj_opterr) {
									fprintf(stderr,"%s: option requires an argument\n",arg);
									return (BADCH);
								}
							}
						}
						if (!opj_optarg && o->has_arg==1) {	/* no argument there */
							if (opj_opterr) {
								fprintf(stderr,"%s: option requires an argument \n",arg);
								return (BADCH);
							}
						}
						++opj_optind;
					}
					++opj_optind;
					if (o->flag)
						*(o->flag)=o->val;
					else
						return o->val;
					return 0;
				}
			}/*(end for)String not found in the list*/
			fprintf(stderr,"Invalid option %s\n",arg);
			++opj_optind;
			return (BADCH);
		}else{ /*Single character input parameter*/
			if (*optstring==':') return ':';
			if (lastidx!=opj_optind) {
				lastidx=opj_optind; lastofs=0;
			}
			opj_optopt=argv[opj_optind][lastofs+1];
			if ((tmp=strchr(optstring,opj_optopt))) {/*Found input parameter in list*/
				if (*tmp==0) {	/* apparently, we looked for \0, i.e. end of argument */
					++opj_optind;
					goto again;
				}
				if (tmp[1]==':') {	/* argument expected */
					if (tmp[2]==':' || argv[opj_optind][lastofs+2]) {	/* "-foo", return "oo" as opj_optarg */
						if (!*(opj_optarg=argv[opj_optind]+lastofs+2)) opj_optarg=0;
						goto found;
					}
					opj_optarg=argv[opj_optind+1];
					if(opj_optarg){
						if (opj_optarg[0] == '-'){ /* Has read next input parameter: No arg for current parameter */
							if (opj_opterr) {
								fprintf(stderr,"%s: option requires an argument\n",arg);
								return (BADCH);
							}
						}
					}
					if (!opj_optarg) {	/* missing argument */
						if (opj_opterr) {
							fprintf(stderr,"%s: option requires an argument\n",arg);
							return (BADCH);
						}
					}
					++opj_optind;
				}else {/*Argument not expected*/
					++lastofs;
					return opj_optopt;
				}
found:
				++opj_optind;
				return opj_optopt;
			}	else {	/* not found */
				fprintf(stderr,"Invalid option %s\n",arg);
				++opj_optind;
				return (BADCH);
			}/*end of not found*/
		
		}/* end of single character*/
	}/*end '-'*/
	fprintf(stderr,"Invalid option\n");
	++opj_optind;
	return (BADCH);;
}